

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_c_zpbeint.c
# Opt level: O0

void gga_c_zpbeint_init(xc_func_type *p)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  gga_c_zpbeint_params *params;
  
  pvVar2 = malloc(0x10);
  in_RDI[0x2f] = pvVar2;
  puVar1 = (undefined8 *)in_RDI[0x2f];
  if (*(int *)*in_RDI == 0x3d) {
    *puVar1 = 0x3faa9fbe76c8b439;
    puVar1[1] = 0x4003333333333333;
  }
  else {
    if (*(int *)*in_RDI != 0x3f) {
      fprintf(_stderr,"Internal error in gga_c_zpbeint\n");
      exit(1);
    }
    *puVar1 = 0x3fa78d4fdf3b645a;
    puVar1[1] = 0x4013333333333333;
  }
  return;
}

Assistant:

static void
gga_c_zpbeint_init(xc_func_type *p)
{
  gga_c_zpbeint_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_c_zpbeint_params));
  params = (gga_c_zpbeint_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_C_ZPBEINT:
    params->beta  = 0.052;
    params->alpha = 2.4;
    break;
  case XC_GGA_C_ZPBESOL:
    params->beta  = 0.046;
    params->alpha = 4.8;
    break;
  default:
    fprintf(stderr, "Internal error in gga_c_zpbeint\n");
    exit(1);
  }
}